

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase *
CreateGenericTypeInstance
          (ExpressionContext *ctx,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> *types)

{
  __jmp_buf_tag *__env;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ScopeData *pSVar4;
  TypeHandle *pTVar5;
  uint uVar6;
  int iVar7;
  TypeClass **ppTVar8;
  ExprBase *node;
  TypeClass *pTVar9;
  size_t sVar10;
  char *dst;
  IntrusiveList<TypeHandle> *pIVar11;
  char *pcVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  InplaceStr className;
  jmp_buf prevErrorHandler;
  
  className = GetGenericClassTypeName(ctx,&proto->super_TypeBase,*types);
  uVar6 = InplaceStr::hash(&className);
  ppTVar8 = HashMap<TypeClass_*>::find(&ctx->genericTypeMap,uVar6);
  if (ppTVar8 == (TypeClass **)0x0) {
    pSVar4 = ctx->scope;
    uVar1 = proto->source;
    uVar2 = proto->scope;
    auVar14._8_4_ = (int)uVar1;
    auVar14._0_8_ = uVar2;
    auVar14._12_4_ = (int)((ulong)uVar1 >> 0x20);
    ctx->scope = (ScopeData *)uVar2;
    ctx->lookupLocation = (SynBase *)auVar14._8_8_;
    __env = ctx->errorHandler;
    memcpy(prevErrorHandler,__env,200);
    bVar3 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    uVar6 = ctx->classInstanceDepth + 1;
    ctx->classInstanceDepth = uVar6;
    if (0x40 < uVar6) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,source,"ERROR: reached maximum generic type instance depth (%d)",0x40);
    }
    uVar6 = *(uint *)(NULLC::traceContext + 0x244);
    iVar7 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar7 != 0) {
      NULLC::TraceLeaveTo(uVar6);
      ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
      ctx->scope = pSVar4;
      ctx->lookupLocation = (SynBase *)0x0;
      pcVar13 = ctx->errorBuf;
      if (pcVar13 != (char *)0x0) {
        sVar10 = strlen(pcVar13);
        pcVar13 = pcVar13 + sVar10;
        iVar7 = NULLC::SafeSprintf(pcVar13,(ulong)(ctx->errorBufSize - (int)sVar10),
                                   "while instantiating generic type %.*s<",
                                   (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                                                (int)(proto->super_TypeBase).name.begin));
        dst = pcVar13 + iVar7;
        pIVar11 = types;
        while( true ) {
          pTVar5 = pIVar11->head;
          if (pTVar5 == (TypeHandle *)0x0) break;
          pcVar12 = ", ";
          if (pTVar5 == types->head) {
            pcVar12 = "";
          }
          iVar7 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) +
                                                ctx->errorBufSize),"%s%.*s",pcVar12,
                                     (ulong)(uint)(*(int *)&(pTVar5->type->name).end -
                                                  (int)(pTVar5->type->name).begin));
          dst = dst + iVar7;
          pIVar11 = (IntrusiveList<TypeHandle> *)&pTVar5->next;
        }
        iVar7 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) +
                                              ctx->errorBufSize),">");
        anon_unknown.dwarf_ff84f::AddRelatedErrorInfoWithLocation(ctx,source,pcVar13,dst + iVar7);
      }
      memcpy(__env,prevErrorHandler,200);
      ctx->errorHandlerNested = bVar3;
      longjmp((__jmp_buf_tag *)__env,1);
    }
    node = AnalyzeClassDefinition(ctx,proto->definition,proto,*types);
    ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
    ctx->scope = pSVar4;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar3;
    if ((node == (ExprBase *)0x0) || (node->typeID != 0x2d)) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,source,"ERROR: type \'%.*s\' couldn\'t be instantiated",
                 (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                              (int)(proto->super_TypeBase).name.begin));
    }
    IntrusiveList<ExprBase>::push_back(&proto->instances,node);
    pTVar9 = (TypeClass *)node[1]._vptr_ExprBase;
  }
  else {
    pTVar9 = *ppTVar8;
  }
  return (TypeBase *)pTVar9;
}

Assistant:

TypeBase* CreateGenericTypeInstance(ExpressionContext &ctx, SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> &types)
{
	InplaceStr className = GetGenericClassTypeName(ctx, proto, types);

	// Check if type already exists
	if(TypeClass **prev = ctx.genericTypeMap.find(className.hash()))
		return *prev;

	// Switch to original type scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(proto->scope, proto->source);

	ExprBase *result = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ctx.classInstanceDepth++;

	if(ctx.classInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic type instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		result = AnalyzeClassDefinition(ctx, proto->definition, proto, types);
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.classInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic type %.*s<", FMT_ISTR(proto->name));

			for(TypeHandle *curr = types.head; curr; curr = curr->next)
			{
				TypeBase *type = curr->type;

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != types.head ? ", " : "", FMT_ISTR(type->name));
			}

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ">");

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	ctx.classInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(ExprClassDefinition *definition = getType<ExprClassDefinition>(result))
	{
		proto->instances.push_back(result);

		return definition->classType;
	}

	Stop(ctx, source, "ERROR: type '%.*s' couldn't be instantiated", FMT_ISTR(proto->name));

	return NULL;
}